

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EVPathRemote.cpp
# Opt level: O3

void adios2::ReadResponseHandler
               (CManager cm,CMConnection conn,void *vevent,void *client_data,attr_list attrs)

{
  char cVar1;
  byte bVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  uint __len;
  shared_ptr<adios2::core::Operator> op;
  string __str;
  string local_108;
  string local_e8;
  undefined1 local_c8 [32];
  _Base_ptr local_a8;
  size_t local_a0;
  char *local_90 [2];
  char local_80 [16];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  cVar1 = *(char *)((long)vevent + 0x10);
  if (cVar1 == '\x7f') {
    memcpy(*(void **)((long)vevent + 8),*(void **)((long)vevent + 0x20),
           *(size_t *)((long)vevent + 0x18));
  }
  else {
    if (cVar1 == '\a') {
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"zfp","");
      local_c8._24_8_ = local_c8 + 8;
      local_c8._0_8_ = (pointer)0x0;
      local_c8._8_8_ = 0;
      local_c8._16_8_ = (_Base_ptr)0x0;
      local_a0 = 0;
      local_a8 = (_Base_ptr)local_c8._24_8_;
      core::MakeOperator((core *)&local_e8,&local_108,(Params *)local_c8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p);
      }
      (**(code **)(*(size_type *)local_e8._M_dataplus._M_p + 0xa8))
                (local_e8._M_dataplus._M_p,*(undefined8 *)((long)vevent + 0x20),
                 *(undefined8 *)((long)vevent + 0x18),*(undefined8 *)((long)vevent + 8));
    }
    else {
      if (cVar1 != '\x03') {
        local_c8._0_8_ = local_c8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"Remote","");
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"EVPathRemote","");
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e8,"ReadResponseHandler","");
        bVar2 = *(byte *)((long)vevent + 0x10);
        __len = 1;
        if (9 < bVar2) {
          __len = 3 - (bVar2 < 100);
        }
        local_90[0] = local_80;
        std::__cxx11::string::_M_construct((ulong)local_90,(char)__len);
        std::__detail::__to_chars_10_impl<unsigned_int>(local_90[0],__len,(uint)bVar2);
        plVar3 = (long *)std::__cxx11::string::replace((ulong)local_90,0,(char *)0x0,0x750997);
        plVar4 = plVar3 + 2;
        if ((long *)*plVar3 == plVar4) {
          local_60 = *plVar4;
          lStack_58 = plVar3[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar4;
          local_70 = (long *)*plVar3;
        }
        local_68 = plVar3[1];
        *plVar3 = (long)plVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
        psVar5 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_50.field_2._M_allocated_capacity = *psVar5;
          local_50.field_2._8_8_ = plVar3[3];
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        }
        else {
          local_50.field_2._M_allocated_capacity = *psVar5;
          local_50._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_50._M_string_length = plVar3[1];
        *plVar3 = (long)psVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        helper::Throw<std::invalid_argument>((string *)local_c8,&local_108,&local_e8,&local_50,-1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if (local_70 != &local_60) {
          operator_delete(local_70);
        }
        if (local_90[0] != local_80) {
          operator_delete(local_90[0]);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p);
        }
        if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
          operator_delete((void *)local_c8._0_8_);
        }
        goto LAB_0065004e;
      }
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"mgard","");
      local_c8._24_8_ = local_c8 + 8;
      local_c8._0_8_ = (pointer)0x0;
      local_c8._8_8_ = 0;
      local_c8._16_8_ = (_Base_ptr)0x0;
      local_a0 = 0;
      local_a8 = (_Base_ptr)local_c8._24_8_;
      core::MakeOperator((core *)&local_e8,&local_108,(Params *)local_c8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p);
      }
      (**(code **)(*(size_type *)local_e8._M_dataplus._M_p + 0xa8))
                (local_e8._M_dataplus._M_p,*(undefined8 *)((long)vevent + 0x20),
                 *(undefined8 *)((long)vevent + 0x18),*(undefined8 *)((long)vevent + 8));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length);
    }
  }
LAB_0065004e:
  CMCondition_signal(cm,*vevent);
  return;
}

Assistant:

void ReadResponseHandler(CManager cm, CMConnection conn, void *vevent, void *client_data,
                         attr_list attrs)
{
    EVPathRemoteCommon::ReadResponseMsg read_response_msg =
        static_cast<EVPathRemoteCommon::ReadResponseMsg>(vevent);

    switch (read_response_msg->OperatorType)
    {
    case adios2::core::Operator::OperatorType::COMPRESS_MGARD: {
        auto op = adios2::core::MakeOperator("mgard", {});
        op->InverseOperate(read_response_msg->ReadData, read_response_msg->Size,
                           (char *)read_response_msg->Dest);
        break;
    }

    case adios2::core::Operator::OperatorType::COMPRESS_ZFP: {
        auto op = adios2::core::MakeOperator("zfp", {});
        op->InverseOperate(read_response_msg->ReadData, read_response_msg->Size,
                           (char *)read_response_msg->Dest);
        break;
    }

    case adios2::core::Operator::OperatorType::COMPRESS_NULL:
        memcpy(read_response_msg->Dest, read_response_msg->ReadData, read_response_msg->Size);
        break;
    default:
        helper::Throw<std::invalid_argument>("Remote", "EVPathRemote", "ReadResponseHandler",
                                             "Invalid operator type " +
                                                 std::to_string(read_response_msg->OperatorType) +
                                                 " received in response");
    }
    CMCondition_signal(cm, read_response_msg->ReadResponseCondition);
    return;
}